

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ticket_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  uint32_t uVar2;
  SSLSessionType SVar3;
  int iVar4;
  pointer psVar5;
  uchar *data;
  size_t len;
  undefined1 local_88 [8];
  CBB ticket_cbb;
  undefined1 local_48 [8];
  Span<const_unsigned_char> ticket;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ticket.size_ = (size_t)hs->ssl;
  if (((hs->min_version < 0x304) && (type != ssl_client_hello_inner)) &&
     (uVar2 = SSL_get_options((SSL *)ticket.size_), (uVar2 & 0x4000) == 0)) {
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_48);
    if (((*(ushort *)(*(long *)(ticket.size_ + 0x30) + 0xdc) >> 4 & 1) == 0) &&
       (bVar1 = std::operator!=((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                (ticket.size_ + 0x58),(nullptr_t)0x0), bVar1)) {
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                          (ticket.size_ + 0x58));
      SVar3 = ssl_session_get_type(psVar5);
      if (SVar3 == kTicket) {
        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                            (ticket.size_ + 0x58));
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)((long)&ticket_cbb.u + 0x18),&psVar5->ticket);
        local_48 = (undefined1  [8])ticket_cbb.u._24_8_;
      }
    }
    iVar4 = CBB_add_u16(out,0x23);
    if ((iVar4 != 0) && (iVar4 = CBB_add_u16_length_prefixed(out,(CBB *)local_88), iVar4 != 0)) {
      data = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_48);
      len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_48);
      iVar4 = CBB_add_bytes((CBB *)local_88,data,len);
      if ((iVar4 != 0) && (iVar4 = CBB_flush(out), iVar4 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ticket_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                       CBB *out_compressible,
                                       ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // TLS 1.3 uses a different ticket extension.
  if (hs->min_version >= TLS1_3_VERSION || type == ssl_client_hello_inner ||
      SSL_get_options(ssl) & SSL_OP_NO_TICKET) {
    return true;
  }

  // Renegotiation does not participate in session resumption. However, still
  // advertise the extension to avoid potentially breaking servers which carry
  // over the state from the previous handshake, such as OpenSSL servers
  // without upstream's 3c3f0259238594d77264a78944d409f2127642c4.
  Span<const uint8_t> ticket;
  if (!ssl->s3->initial_handshake_complete &&  //
      ssl->session != nullptr &&
      ssl_session_get_type(ssl->session.get()) == SSLSessionType::kTicket) {
    ticket = ssl->session->ticket;
  }

  CBB ticket_cbb;
  if (!CBB_add_u16(out, TLSEXT_TYPE_session_ticket) ||
      !CBB_add_u16_length_prefixed(out, &ticket_cbb) ||
      !CBB_add_bytes(&ticket_cbb, ticket.data(), ticket.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}